

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcExtTokens.cpp
# Opt level: O3

int __thiscall deqp::GLExtTokens::init(GLExtTokens *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  GLenum GVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLenum *pGVar7;
  bool bVar8;
  uint uVar9;
  GLenum GVar10;
  GLenum GVar11;
  GLenum GVar12;
  GLenum GVar13;
  GLenum GVar14;
  GLenum GVar15;
  GLenum GVar16;
  GLenum GVar17;
  GLenum GVar18;
  GLenum GVar19;
  GLenum GVar20;
  GLenum GVar21;
  GLenum GVar22;
  GLenum GVar23;
  GLenum GVar24;
  GLenum GVar25;
  GLenum GVar26;
  GLenum GVar27;
  GLenum GVar28;
  GLenum GVar29;
  GLenum GVar30;
  undefined4 uVar31;
  GLenum GVar32;
  
  bVar1 = glu::contextSupports((ApiType)*(ApiType *)ctx,(ApiType)0x23);
  uVar9 = (uint)bVar1;
  bVar8 = !bVar1;
  GVar11 = 0x8e88;
  if (bVar1) {
    GVar11 = 0x8e72;
  }
  GVar12 = 0x8e87;
  if (!bVar1) {
    GVar12 = 0xe;
  }
  GVar13 = 0x8e7d;
  if (bVar1) {
    GVar13 = 0xe;
  }
  GVar14 = 0x8e7e;
  if (!bVar1) {
    GVar14 = 0x886c;
  }
  GVar15 = 0x8e83;
  if (bVar1) {
    GVar15 = 0x886c;
  }
  GVar16 = 0x886d;
  GVar2 = 0x8e84;
  if (!bVar1) {
    GVar2 = 0x886d;
  }
  GVar3 = 0x8e86;
  if (!bVar1) {
    GVar16 = 0x8e86;
  }
  GVar17 = 0x92d4;
  if (!bVar1) {
    GVar3 = 0x92d4;
  }
  GVar4 = 0x92ce;
  if (!bVar1) {
    GVar17 = 0x92ce;
  }
  GVar18 = 0x90d8;
  if (!bVar1) {
    GVar4 = 0x90d8;
  }
  GVar5 = 0x92d3;
  if (!bVar1) {
    GVar18 = 0x92d3;
  }
  GVar19 = 0x92cd;
  if (!bVar1) {
    GVar5 = 0x92cd;
  }
  GVar23 = 0x90d9;
  if (!bVar1) {
    GVar19 = 0x90d9;
  }
  if (!bVar1) {
    GVar23 = 0x8c2b;
  }
  GVar20 = 0x9309;
  if (bVar1) {
    GVar20 = 0x8c2b;
  }
  GVar21 = 0x8e75;
  if (bVar1) {
    GVar21 = 0x9308;
  }
  GVar22 = 8;
  if (bVar1) {
    GVar22 = 0x8e78;
  }
  this->GEOMETRY_SHADER = 0x8dd9;
  this->GEOMETRY_SHADER_BIT = 4;
  this->GEOMETRY_LINKED_VERTICES_OUT = 0x8916;
  this->GEOMETRY_LINKED_INPUT_TYPE = 0x8917;
  this->GEOMETRY_LINKED_OUTPUT_TYPE = 0x8918;
  this->GEOMETRY_SHADER_INVOCATIONS = 0x887f;
  this->MAX_GEOMETRY_TEXTURE_IMAGE_UNITS = 0x8c29;
  this->MAX_GEOMETRY_IMAGE_UNIFORMS = 0x90cd;
  this->MAX_GEOMETRY_SHADER_STORAGE_BLOCKS = 0x90d7;
  this->MAX_GEOMETRY_ATOMIC_COUNTERS = 0x92d5;
  this->LINE_STRIP_ADJACENCY = 0xb;
  this->LINES_ADJACENCY = 10;
  this->LAYER_PROVOKING_VERTEX = 0x825e;
  this->FIRST_VERTEX_CONVENTION = 0x8e4d;
  this->LAST_VERTEX_CONVENTION = 0x8e4e;
  this->UNDEFINED_VERTEX = 0x8260;
  this->TRIANGLES_ADJACENCY = 0xc;
  this->TRIANGLE_STRIP_ADJACENCY = 0xd;
  this->FRAMEBUFFER_ATTACHMENT_LAYERED = 0x8da7;
  this->FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS = 0x8da8;
  this->FRAMEBUFFER_DEFAULT_LAYERS = 0x9312;
  this->MAX_FRAMEBUFFER_LAYERS = 0x9317;
  this->MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS = 0x8a32;
  this->MAX_GEOMETRY_UNIFORM_COMPONENTS = 0x8ddf;
  this->MAX_GEOMETRY_UNIFORM_BLOCKS = 0x8a2c;
  this->MAX_GEOMETRY_INPUT_COMPONENTS = 0x9123;
  this->MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS = 0x8de1;
  this->MAX_GEOMETRY_OUTPUT_COMPONENTS = 0x9124;
  this->MAX_GEOMETRY_OUTPUT_VERTICES = 0x8de0;
  this->MAX_GEOMETRY_SHADER_INVOCATIONS = 0x8e5a;
  this->MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS = 0x92cf;
  this->PRIMITIVES_GENERATED = 0x8c87;
  this->TEXTURE_BORDER_COLOR = 0x1004;
  GVar6 = 0x812d;
  GVar28 = 0x8e72;
  if (bVar1) {
    GVar28 = GVar6;
  }
  uVar31 = 0x919d;
  if (bVar1) {
    GVar6 = 0x919d;
  }
  this->TEXTURE_BUFFER_BINDING = 0x8c2a;
  GVar30 = 0x10;
  if (!bVar1) {
    GVar30 = 0x8c2a;
  }
  GVar10 = 0x919e;
  GVar26 = 0x8c2a;
  if (bVar1) {
    uVar31 = 0x8c2c;
  }
  else {
    GVar26 = GVar10;
    GVar10 = 0x8c2c;
  }
  GVar29 = 0x919f;
  if (bVar1) {
    GVar29 = 0x8dc2;
  }
  GVar32 = 0x8dd0;
  if (!bVar1) {
    GVar32 = 0x8dc2;
  }
  pGVar7 = &this->TEXTURE_BUFFER_OFFSET;
  if (!bVar1) {
    pGVar7 = &this->CLAMP_TO_BORDER;
  }
  GVar25 = 0x9051;
  GVar27 = 0x8dd8;
  if (bVar1) {
    GVar27 = GVar25;
  }
  this->TEXTURE_BUFFER_DATA_STORE_BINDING = 0x8c2d;
  GVar24 = 0x905c;
  if (bVar1) {
    GVar25 = 0x905c;
  }
  *pGVar7 = GVar6;
  GVar6 = 0x9067;
  if (bVar1) {
    GVar24 = 0x9067;
    GVar6 = 0x919f;
  }
  (&this->CLAMP_TO_BORDER)[bVar8] = GVar28;
  (&this->PATCH_VERTICES)[bVar8] = GVar11;
  (&this->TESS_CONTROL_SHADER)[bVar8] = bVar1 + 0x8e87;
  (&this->TESS_EVALUATION_SHADER)[bVar8] = GVar12;
  (&this->PATCHES)[bVar8] = GVar13;
  (&this->MAX_PATCH_VERTICES)[bVar8] = 0x8e7e - bVar1;
  (&this->MAX_TESS_GEN_LEVEL)[bVar8] = GVar14;
  (&this->MAX_TESS_CONTROL_INPUT_COMPONENTS)[bVar8] = GVar15;
  (&this->MAX_TESS_CONTROL_OUTPUT_COMPONENTS)[bVar8] = 0x8e84 - bVar1;
  (&this->MAX_TESS_PATCH_COMPONENTS)[bVar8] = GVar2;
  (&this->MAX_TESS_EVALUATION_INPUT_COMPONENTS)[bVar8] = GVar16;
  (&this->MAX_TESS_EVALUATION_OUTPUT_COMPONENTS)[bVar8] = GVar3;
  (&this->MAX_TESS_EVALUATION_ATOMIC_COUNTERS)[bVar8] = GVar17;
  (&this->MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS)[bVar8] = GVar4;
  (&this->MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS)[bVar8] = GVar18;
  (&this->MAX_TESS_CONTROL_ATOMIC_COUNTERS)[bVar8] = GVar5;
  (&this->MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS)[bVar8] = GVar19;
  (&this->MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS)[bVar8] = GVar23;
  (&this->MAX_TEXTURE_BUFFER_SIZE)[bVar8] = GVar20;
  (&this->REFERENCED_BY_GEOMETRY_SHADER)[bVar8] = bVar1 + 0x9307 + (uint)bVar1;
  (&this->REFERENCED_BY_TESS_CONTROL_SHADER)[bVar8] = 0x9308 - uVar9;
  (&this->REFERENCED_BY_TESS_EVALUATION_SHADER)[bVar8] = GVar21;
  (&this->TESS_CONTROL_OUTPUT_VERTICES)[bVar8] = 0x8e76 - uVar9;
  (&this->TESS_GEN_MODE)[bVar8] = uVar9 ^ 0x8e77;
  (&this->TESS_GEN_SPACING)[bVar8] = (uint)bVar8 + (uint)bVar8 + 0x8e77;
  (&this->TESS_GEN_POINT_MODE)[bVar8] = bVar1 + 0x8e78;
  (&this->TESS_GEN_VERTEX_ORDER)[bVar8] = GVar22;
  (&this->TESS_CONTROL_SHADER_BIT)[bVar8] = (uint)bVar8 * 8 + 8;
  (&this->TESS_EVALUATION_SHADER_BIT)[bVar8] = GVar30;
  (&this->TEXTURE_BUFFER)[bVar8] = GVar26;
  (&this->TEXTURE_BUFFER_SIZE)[bVar8] = GVar10;
  *(undefined4 *)((long)&this->TEXTURE_BINDING_BUFFER + (ulong)((uint)bVar8 * 8)) = uVar31;
  pGVar7 = &this->SAMPLER_BUFFER;
  if (!bVar1) {
    pGVar7 = &this->TEXTURE_BUFFER_OFFSET_ALIGNMENT;
  }
  *pGVar7 = GVar29;
  (&this->SAMPLER_BUFFER)[bVar1] = GVar32;
  (&this->INT_SAMPLER_BUFFER)[bVar1] = (uint)bVar1 * 8 + 0x8dd0;
  (&this->UNSIGNED_INT_SAMPLER_BUFFER)[bVar1] = GVar27;
  (&this->IMAGE_BUFFER)[bVar1] = GVar25;
  (&this->INT_IMAGE_BUFFER)[bVar1] = GVar24;
  (&this->UNSIGNED_INT_IMAGE_BUFFER)[bVar1] = GVar6;
  this->QUADS = 7;
  this->ISOLINES = 0x8e7a;
  this->FRACTIONAL_EVEN = 0x8e7c;
  this->FRACTIONAL_ODD = 0x8e7b;
  this->COMPRESSED_RGBA_ASTC_4x4 = 0x93b0;
  this->COMPRESSED_RGBA_ASTC_5x4 = 0x93b1;
  this->COMPRESSED_RGBA_ASTC_5x5 = 0x93b2;
  this->COMPRESSED_RGBA_ASTC_6x5 = 0x93b3;
  this->COMPRESSED_RGBA_ASTC_6x6 = 0x93b4;
  this->COMPRESSED_RGBA_ASTC_8x5 = 0x93b5;
  this->COMPRESSED_RGBA_ASTC_8x6 = 0x93b6;
  this->COMPRESSED_RGBA_ASTC_8x8 = 0x93b7;
  this->COMPRESSED_RGBA_ASTC_10x5 = 0x93b8;
  this->COMPRESSED_RGBA_ASTC_10x6 = 0x93b9;
  this->COMPRESSED_RGBA_ASTC_10x8 = 0x93ba;
  this->COMPRESSED_RGBA_ASTC_10x10 = 0x93bb;
  this->COMPRESSED_RGBA_ASTC_12x10 = 0x93bc;
  this->COMPRESSED_RGBA_ASTC_12x12 = 0x93bd;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_4x4 = 0x93d0;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_5x4 = 0x93d1;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_5x5 = 0x93d2;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_6x5 = 0x93d3;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_6x6 = 0x93d4;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_8x5 = 0x93d5;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_8x6 = 0x93d6;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_8x8 = 0x93d7;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_10x5 = 0x93d8;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_10x6 = 0x93d9;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_10x8 = 0x93da;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_10x10 = 0x93db;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_12x10 = 0x93dc;
  this->COMPRESSED_SRGB8_ALPHA8_ASTC_12x12 = 0x93dd;
  this->MULTIPLY = 0x9294;
  this->SCREEN = 0x9295;
  this->OVERLAY = 0x9296;
  this->DARKEN = 0x9297;
  this->LIGHTEN = 0x9298;
  this->COLORDODGE = 0x9299;
  this->COLORBURN = 0x929a;
  this->HARDLIGHT = 0x929b;
  this->SOFTLIGHT = 0x929c;
  this->DIFFERENCE = 0x929e;
  this->EXCLUSION = 0x92a0;
  this->HSL_HUE = 0x92ad;
  this->HSL_SATURATION = 0x92ae;
  this->HSL_COLOR = 0x92af;
  this->HSL_LUMINOSITY = 0x92b0;
  this->PRIMITIVE_BOUNDING_BOX = 0x92be;
  return GVar6;
}

Assistant:

void GLExtTokens::init(const glu::ContextType& contextType)
{
	if (glu::contextSupports(contextType, glu::ApiType::es(3, 2)))
	{
		GEOMETRY_SHADER							   = GL_GEOMETRY_SHADER;
		GEOMETRY_SHADER_BIT						   = GL_GEOMETRY_SHADER_BIT;
		GEOMETRY_LINKED_VERTICES_OUT			   = GL_GEOMETRY_VERTICES_OUT;
		GEOMETRY_LINKED_INPUT_TYPE				   = GL_GEOMETRY_INPUT_TYPE;
		GEOMETRY_LINKED_OUTPUT_TYPE				   = GL_GEOMETRY_OUTPUT_TYPE;
		GEOMETRY_SHADER_INVOCATIONS				   = GL_GEOMETRY_SHADER_INVOCATIONS;
		MAX_GEOMETRY_TEXTURE_IMAGE_UNITS		   = GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS;
		MAX_GEOMETRY_IMAGE_UNIFORMS				   = GL_MAX_GEOMETRY_IMAGE_UNIFORMS;
		MAX_GEOMETRY_SHADER_STORAGE_BLOCKS		   = GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS;
		MAX_GEOMETRY_ATOMIC_COUNTERS			   = GL_MAX_GEOMETRY_ATOMIC_COUNTERS;
		LINE_STRIP_ADJACENCY					   = GL_LINE_STRIP_ADJACENCY;
		LINES_ADJACENCY							   = GL_LINES_ADJACENCY;
		TRIANGLES_ADJACENCY						   = GL_TRIANGLES_ADJACENCY;
		TRIANGLE_STRIP_ADJACENCY				   = GL_TRIANGLE_STRIP_ADJACENCY;
		FRAMEBUFFER_ATTACHMENT_LAYERED			   = GL_FRAMEBUFFER_ATTACHMENT_LAYERED;
		LAYER_PROVOKING_VERTEX					   = GL_LAYER_PROVOKING_VERTEX;
		FIRST_VERTEX_CONVENTION					   = GL_FIRST_VERTEX_CONVENTION;
		LAST_VERTEX_CONVENTION					   = GL_LAST_VERTEX_CONVENTION;
		UNDEFINED_VERTEX						   = GL_UNDEFINED_VERTEX;
		FRAMEBUFFER_DEFAULT_LAYERS				   = GL_FRAMEBUFFER_DEFAULT_LAYERS;
		FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS	   = GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS;
		MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS   = GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS;
		MAX_FRAMEBUFFER_LAYERS					   = GL_MAX_FRAMEBUFFER_LAYERS;
		MAX_GEOMETRY_UNIFORM_COMPONENTS			   = GL_MAX_GEOMETRY_UNIFORM_COMPONENTS;
		MAX_GEOMETRY_UNIFORM_BLOCKS				   = GL_MAX_GEOMETRY_UNIFORM_BLOCKS;
		MAX_GEOMETRY_INPUT_COMPONENTS			   = GL_MAX_GEOMETRY_INPUT_COMPONENTS;
		MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS	   = GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS;
		MAX_GEOMETRY_OUTPUT_COMPONENTS			   = GL_MAX_GEOMETRY_OUTPUT_COMPONENTS;
		MAX_GEOMETRY_OUTPUT_VERTICES			   = GL_MAX_GEOMETRY_OUTPUT_VERTICES;
		MAX_GEOMETRY_SHADER_INVOCATIONS			   = GL_MAX_GEOMETRY_SHADER_INVOCATIONS;
		MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS		   = GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS;
		PRIMITIVES_GENERATED					   = GL_PRIMITIVES_GENERATED;
		TEXTURE_BORDER_COLOR					   = GL_TEXTURE_BORDER_COLOR;
		TEXTURE_BUFFER_BINDING					   = GL_TEXTURE_BUFFER_BINDING;
		TEXTURE_BUFFER_DATA_STORE_BINDING		   = GL_TEXTURE_BUFFER_DATA_STORE_BINDING;
		TEXTURE_BUFFER_OFFSET					   = GL_TEXTURE_BUFFER_OFFSET;
		CLAMP_TO_BORDER							   = GL_CLAMP_TO_BORDER;
		PATCH_VERTICES							   = GL_PATCH_VERTICES;
		TESS_CONTROL_SHADER						   = GL_TESS_CONTROL_SHADER;
		TESS_EVALUATION_SHADER					   = GL_TESS_EVALUATION_SHADER;
		PATCHES									   = GL_PATCHES;
		MAX_PATCH_VERTICES						   = GL_MAX_PATCH_VERTICES;
		MAX_TESS_GEN_LEVEL						   = GL_MAX_TESS_GEN_LEVEL;
		MAX_TESS_CONTROL_INPUT_COMPONENTS		   = GL_MAX_TESS_CONTROL_INPUT_COMPONENTS;
		MAX_TESS_CONTROL_OUTPUT_COMPONENTS		   = GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS;
		MAX_TESS_PATCH_COMPONENTS				   = GL_MAX_TESS_PATCH_COMPONENTS;
		MAX_TESS_EVALUATION_INPUT_COMPONENTS	   = GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS;
		MAX_TESS_EVALUATION_OUTPUT_COMPONENTS	  = GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS;
		MAX_TESS_EVALUATION_ATOMIC_COUNTERS		   = GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS;
		MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS = GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS;
		MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS	 = GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS;
		MAX_TESS_CONTROL_ATOMIC_COUNTERS		   = GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS;
		MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS	= GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS;
		MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS  = GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS;
		MAX_TEXTURE_BUFFER_SIZE					   = GL_MAX_TEXTURE_BUFFER_SIZE;
		REFERENCED_BY_GEOMETRY_SHADER			   = GL_REFERENCED_BY_GEOMETRY_SHADER;
		REFERENCED_BY_TESS_CONTROL_SHADER		   = GL_REFERENCED_BY_TESS_CONTROL_SHADER;
		REFERENCED_BY_TESS_EVALUATION_SHADER	   = GL_REFERENCED_BY_TESS_EVALUATION_SHADER;
		TESS_CONTROL_OUTPUT_VERTICES			   = GL_TESS_CONTROL_OUTPUT_VERTICES;
		TESS_GEN_MODE							   = GL_TESS_GEN_MODE;
		TESS_GEN_SPACING						   = GL_TESS_GEN_SPACING;
		TESS_GEN_POINT_MODE						   = GL_TESS_GEN_POINT_MODE;
		TESS_GEN_VERTEX_ORDER					   = GL_TESS_GEN_VERTEX_ORDER;
		TESS_CONTROL_SHADER_BIT					   = GL_TESS_CONTROL_SHADER_BIT;
		TESS_EVALUATION_SHADER_BIT				   = GL_TESS_EVALUATION_SHADER_BIT;
		TEXTURE_BUFFER							   = GL_TEXTURE_BUFFER;
		TEXTURE_BUFFER_SIZE						   = GL_TEXTURE_BUFFER_SIZE;
		TEXTURE_BINDING_BUFFER					   = GL_TEXTURE_BINDING_BUFFER;
		SAMPLER_BUFFER							   = GL_SAMPLER_BUFFER;
		INT_SAMPLER_BUFFER						   = GL_INT_SAMPLER_BUFFER;
		UNSIGNED_INT_SAMPLER_BUFFER				   = GL_UNSIGNED_INT_SAMPLER_BUFFER;
		IMAGE_BUFFER							   = GL_IMAGE_BUFFER;
		INT_IMAGE_BUFFER						   = GL_INT_IMAGE_BUFFER;
		UNSIGNED_INT_IMAGE_BUFFER				   = GL_UNSIGNED_INT_IMAGE_BUFFER;
		TEXTURE_BUFFER_OFFSET_ALIGNMENT			   = GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT;
		QUADS									   = GL_QUADS;
		ISOLINES								   = GL_ISOLINES;
		FRACTIONAL_EVEN							   = GL_FRACTIONAL_EVEN;
		FRACTIONAL_ODD							   = GL_FRACTIONAL_ODD;
		COMPRESSED_RGBA_ASTC_4x4				   = GL_COMPRESSED_RGBA_ASTC_4x4;
		COMPRESSED_RGBA_ASTC_5x4				   = GL_COMPRESSED_RGBA_ASTC_5x4;
		COMPRESSED_RGBA_ASTC_5x5				   = GL_COMPRESSED_RGBA_ASTC_5x5;
		COMPRESSED_RGBA_ASTC_6x5				   = GL_COMPRESSED_RGBA_ASTC_6x5;
		COMPRESSED_RGBA_ASTC_6x6				   = GL_COMPRESSED_RGBA_ASTC_6x6;
		COMPRESSED_RGBA_ASTC_8x5				   = GL_COMPRESSED_RGBA_ASTC_8x5;
		COMPRESSED_RGBA_ASTC_8x6				   = GL_COMPRESSED_RGBA_ASTC_8x6;
		COMPRESSED_RGBA_ASTC_8x8				   = GL_COMPRESSED_RGBA_ASTC_8x8;
		COMPRESSED_RGBA_ASTC_10x5				   = GL_COMPRESSED_RGBA_ASTC_10x5;
		COMPRESSED_RGBA_ASTC_10x6				   = GL_COMPRESSED_RGBA_ASTC_10x6;
		COMPRESSED_RGBA_ASTC_10x8				   = GL_COMPRESSED_RGBA_ASTC_10x8;
		COMPRESSED_RGBA_ASTC_10x10				   = GL_COMPRESSED_RGBA_ASTC_10x10;
		COMPRESSED_RGBA_ASTC_12x10				   = GL_COMPRESSED_RGBA_ASTC_12x10;
		COMPRESSED_RGBA_ASTC_12x12				   = GL_COMPRESSED_RGBA_ASTC_12x12;
		COMPRESSED_SRGB8_ALPHA8_ASTC_4x4		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4;
		COMPRESSED_SRGB8_ALPHA8_ASTC_5x4		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4;
		COMPRESSED_SRGB8_ALPHA8_ASTC_5x5		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5;
		COMPRESSED_SRGB8_ALPHA8_ASTC_6x5		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5;
		COMPRESSED_SRGB8_ALPHA8_ASTC_6x6		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6;
		COMPRESSED_SRGB8_ALPHA8_ASTC_8x5		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5;
		COMPRESSED_SRGB8_ALPHA8_ASTC_8x6		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6;
		COMPRESSED_SRGB8_ALPHA8_ASTC_8x8		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8;
		COMPRESSED_SRGB8_ALPHA8_ASTC_10x5		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5;
		COMPRESSED_SRGB8_ALPHA8_ASTC_10x6		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6;
		COMPRESSED_SRGB8_ALPHA8_ASTC_10x8		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8;
		COMPRESSED_SRGB8_ALPHA8_ASTC_10x10		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10;
		COMPRESSED_SRGB8_ALPHA8_ASTC_12x10		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10;
		COMPRESSED_SRGB8_ALPHA8_ASTC_12x12		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12;
		MULTIPLY								   = GL_MULTIPLY;
		SCREEN									   = GL_SCREEN;
		OVERLAY									   = GL_OVERLAY;
		DARKEN									   = GL_DARKEN;
		LIGHTEN									   = GL_LIGHTEN;
		COLORDODGE								   = GL_COLORDODGE;
		COLORBURN								   = GL_COLORBURN;
		HARDLIGHT								   = GL_HARDLIGHT;
		SOFTLIGHT								   = GL_SOFTLIGHT;
		DIFFERENCE								   = GL_DIFFERENCE;
		EXCLUSION								   = GL_EXCLUSION;
		HSL_HUE									   = GL_HSL_HUE;
		HSL_SATURATION							   = GL_HSL_SATURATION;
		HSL_COLOR								   = GL_HSL_COLOR;
		HSL_LUMINOSITY							   = GL_HSL_LUMINOSITY;
		PRIMITIVE_BOUNDING_BOX					   = GL_PRIMITIVE_BOUNDING_BOX;
	}
	else
	{
		GEOMETRY_SHADER							   = GL_GEOMETRY_SHADER_EXT;
		GEOMETRY_SHADER_BIT						   = GL_GEOMETRY_SHADER_BIT_EXT;
		GEOMETRY_LINKED_VERTICES_OUT			   = GL_GEOMETRY_LINKED_VERTICES_OUT_EXT;
		GEOMETRY_LINKED_INPUT_TYPE				   = GL_GEOMETRY_LINKED_INPUT_TYPE_EXT;
		GEOMETRY_LINKED_OUTPUT_TYPE				   = GL_GEOMETRY_LINKED_OUTPUT_TYPE_EXT;
		GEOMETRY_SHADER_INVOCATIONS				   = GL_GEOMETRY_SHADER_INVOCATIONS_EXT;
		MAX_GEOMETRY_TEXTURE_IMAGE_UNITS		   = GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT;
		MAX_GEOMETRY_IMAGE_UNIFORMS				   = GL_MAX_GEOMETRY_IMAGE_UNIFORMS_EXT;
		MAX_GEOMETRY_SHADER_STORAGE_BLOCKS		   = GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS_EXT;
		MAX_GEOMETRY_ATOMIC_COUNTERS			   = GL_MAX_GEOMETRY_ATOMIC_COUNTERS_EXT;
		LINE_STRIP_ADJACENCY					   = GL_LINE_STRIP_ADJACENCY_EXT;
		LINES_ADJACENCY							   = GL_LINES_ADJACENCY_EXT;
		TRIANGLES_ADJACENCY						   = GL_TRIANGLES_ADJACENCY_EXT;
		TRIANGLE_STRIP_ADJACENCY				   = GL_TRIANGLE_STRIP_ADJACENCY_EXT;
		FRAMEBUFFER_ATTACHMENT_LAYERED			   = GL_FRAMEBUFFER_ATTACHMENT_LAYERED_EXT;
		LAYER_PROVOKING_VERTEX					   = GL_LAYER_PROVOKING_VERTEX_EXT;
		FIRST_VERTEX_CONVENTION					   = GL_FIRST_VERTEX_CONVENTION_EXT;
		LAST_VERTEX_CONVENTION					   = GL_LAST_VERTEX_CONVENTION_EXT;
		UNDEFINED_VERTEX						   = GL_UNDEFINED_VERTEX_EXT;
		FRAMEBUFFER_DEFAULT_LAYERS				   = GL_FRAMEBUFFER_DEFAULT_LAYERS_EXT;
		FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS	   = GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS_EXT;
		MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS   = GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS_EXT;
		MAX_FRAMEBUFFER_LAYERS					   = GL_MAX_FRAMEBUFFER_LAYERS_EXT;
		MAX_GEOMETRY_UNIFORM_COMPONENTS			   = GL_MAX_GEOMETRY_UNIFORM_COMPONENTS_EXT;
		MAX_GEOMETRY_UNIFORM_BLOCKS				   = GL_MAX_GEOMETRY_UNIFORM_BLOCKS_EXT;
		MAX_GEOMETRY_INPUT_COMPONENTS			   = GL_MAX_GEOMETRY_INPUT_COMPONENTS_EXT;
		MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS	   = GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS_EXT;
		MAX_GEOMETRY_OUTPUT_COMPONENTS			   = GL_MAX_GEOMETRY_OUTPUT_COMPONENTS_EXT;
		MAX_GEOMETRY_OUTPUT_VERTICES			   = GL_MAX_GEOMETRY_OUTPUT_VERTICES_EXT;
		MAX_GEOMETRY_SHADER_INVOCATIONS			   = GL_MAX_GEOMETRY_SHADER_INVOCATIONS_EXT;
		MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS		   = GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT;
		PRIMITIVES_GENERATED					   = GL_PRIMITIVES_GENERATED_EXT;
		TEXTURE_BORDER_COLOR					   = GL_TEXTURE_BORDER_COLOR_EXT;
		TEXTURE_BUFFER_BINDING					   = GL_TEXTURE_BUFFER_BINDING_EXT;
		TEXTURE_BUFFER_DATA_STORE_BINDING		   = GL_TEXTURE_BUFFER_DATA_STORE_BINDING_EXT;
		CLAMP_TO_BORDER							   = GL_CLAMP_TO_BORDER_EXT;
		PATCH_VERTICES							   = GL_PATCH_VERTICES_EXT;
		TESS_CONTROL_SHADER						   = GL_TESS_CONTROL_SHADER_EXT;
		TESS_EVALUATION_SHADER					   = GL_TESS_EVALUATION_SHADER_EXT;
		PATCHES									   = GL_PATCHES_EXT;
		MAX_PATCH_VERTICES						   = GL_MAX_PATCH_VERTICES_EXT;
		MAX_TESS_GEN_LEVEL						   = GL_MAX_TESS_GEN_LEVEL_EXT;
		MAX_TESS_CONTROL_INPUT_COMPONENTS		   = GL_MAX_TESS_CONTROL_INPUT_COMPONENTS_EXT;
		MAX_TESS_CONTROL_OUTPUT_COMPONENTS		   = GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS_EXT;
		MAX_TESS_PATCH_COMPONENTS				   = GL_MAX_TESS_PATCH_COMPONENTS_EXT;
		MAX_TESS_EVALUATION_INPUT_COMPONENTS	   = GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS_EXT;
		MAX_TESS_EVALUATION_OUTPUT_COMPONENTS	  = GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS_EXT;
		MAX_TESS_EVALUATION_ATOMIC_COUNTERS		   = GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS_EXT;
		MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS = GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS_EXT;
		MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS	 = GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS_EXT;
		MAX_TESS_CONTROL_ATOMIC_COUNTERS		   = GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS_EXT;
		MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS	= GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS_EXT;
		MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS  = GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS_EXT;
		MAX_TEXTURE_BUFFER_SIZE					   = GL_MAX_TEXTURE_BUFFER_SIZE_EXT;
		REFERENCED_BY_GEOMETRY_SHADER			   = GL_REFERENCED_BY_GEOMETRY_SHADER_EXT;
		REFERENCED_BY_TESS_CONTROL_SHADER		   = GL_REFERENCED_BY_TESS_CONTROL_SHADER_EXT;
		REFERENCED_BY_TESS_EVALUATION_SHADER	   = GL_REFERENCED_BY_TESS_EVALUATION_SHADER_EXT;
		TESS_CONTROL_OUTPUT_VERTICES			   = GL_TESS_CONTROL_OUTPUT_VERTICES_EXT;
		TESS_GEN_MODE							   = GL_TESS_GEN_MODE_EXT;
		TESS_GEN_SPACING						   = GL_TESS_GEN_SPACING_EXT;
		TESS_GEN_POINT_MODE						   = GL_TESS_GEN_POINT_MODE_EXT;
		TESS_GEN_VERTEX_ORDER					   = GL_TESS_GEN_VERTEX_ORDER_EXT;
		TESS_CONTROL_SHADER_BIT					   = GL_TESS_CONTROL_SHADER_BIT_EXT;
		TESS_EVALUATION_SHADER_BIT				   = GL_TESS_EVALUATION_SHADER_BIT_EXT;
		TEXTURE_BUFFER							   = GL_TEXTURE_BUFFER_EXT;
		TEXTURE_BUFFER_SIZE						   = GL_TEXTURE_BUFFER_SIZE_EXT;
		TEXTURE_BINDING_BUFFER					   = GL_TEXTURE_BINDING_BUFFER_EXT;
		TEXTURE_BUFFER_OFFSET					   = GL_TEXTURE_BUFFER_OFFSET_EXT;
		TEXTURE_BUFFER_OFFSET_ALIGNMENT			   = GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT_EXT;
		SAMPLER_BUFFER							   = GL_SAMPLER_BUFFER_EXT;
		INT_SAMPLER_BUFFER						   = GL_INT_SAMPLER_BUFFER_EXT;
		UNSIGNED_INT_SAMPLER_BUFFER				   = GL_UNSIGNED_INT_SAMPLER_BUFFER_EXT;
		IMAGE_BUFFER							   = GL_IMAGE_BUFFER_EXT;
		INT_IMAGE_BUFFER						   = GL_INT_IMAGE_BUFFER_EXT;
		UNSIGNED_INT_IMAGE_BUFFER				   = GL_UNSIGNED_INT_IMAGE_BUFFER_EXT;
		QUADS									   = GL_QUADS_EXT;
		ISOLINES								   = GL_ISOLINES_EXT;
		FRACTIONAL_EVEN							   = GL_FRACTIONAL_EVEN_EXT;
		FRACTIONAL_ODD							   = GL_FRACTIONAL_ODD_EXT;
		COMPRESSED_RGBA_ASTC_4x4				   = GL_COMPRESSED_RGBA_ASTC_4x4_KHR;
		COMPRESSED_RGBA_ASTC_5x4				   = GL_COMPRESSED_RGBA_ASTC_5x4_KHR;
		COMPRESSED_RGBA_ASTC_5x5				   = GL_COMPRESSED_RGBA_ASTC_5x5_KHR;
		COMPRESSED_RGBA_ASTC_6x5				   = GL_COMPRESSED_RGBA_ASTC_6x5_KHR;
		COMPRESSED_RGBA_ASTC_6x6				   = GL_COMPRESSED_RGBA_ASTC_6x6_KHR;
		COMPRESSED_RGBA_ASTC_8x5				   = GL_COMPRESSED_RGBA_ASTC_8x5_KHR;
		COMPRESSED_RGBA_ASTC_8x6				   = GL_COMPRESSED_RGBA_ASTC_8x6_KHR;
		COMPRESSED_RGBA_ASTC_8x8				   = GL_COMPRESSED_RGBA_ASTC_8x8_KHR;
		COMPRESSED_RGBA_ASTC_10x5				   = GL_COMPRESSED_RGBA_ASTC_10x5_KHR;
		COMPRESSED_RGBA_ASTC_10x6				   = GL_COMPRESSED_RGBA_ASTC_10x6_KHR;
		COMPRESSED_RGBA_ASTC_10x8				   = GL_COMPRESSED_RGBA_ASTC_10x8_KHR;
		COMPRESSED_RGBA_ASTC_10x10				   = GL_COMPRESSED_RGBA_ASTC_10x10_KHR;
		COMPRESSED_RGBA_ASTC_12x10				   = GL_COMPRESSED_RGBA_ASTC_12x10_KHR;
		COMPRESSED_RGBA_ASTC_12x12				   = GL_COMPRESSED_RGBA_ASTC_12x12_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_4x4		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_5x4		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_5x5		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_6x5		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_6x6		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_8x5		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_8x6		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_8x8		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_10x5		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_10x6		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_10x8		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_10x10		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_12x10		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10_KHR;
		COMPRESSED_SRGB8_ALPHA8_ASTC_12x12		   = GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12_KHR;
		MULTIPLY								   = GL_MULTIPLY_KHR;
		SCREEN									   = GL_SCREEN_KHR;
		OVERLAY									   = GL_OVERLAY_KHR;
		DARKEN									   = GL_DARKEN_KHR;
		LIGHTEN									   = GL_LIGHTEN_KHR;
		COLORDODGE								   = GL_COLORDODGE_KHR;
		COLORBURN								   = GL_COLORBURN_KHR;
		HARDLIGHT								   = GL_HARDLIGHT_KHR;
		SOFTLIGHT								   = GL_SOFTLIGHT_KHR;
		DIFFERENCE								   = GL_DIFFERENCE_KHR;
		EXCLUSION								   = GL_EXCLUSION_KHR;
		HSL_HUE									   = GL_HSL_HUE_KHR;
		HSL_SATURATION							   = GL_HSL_SATURATION_KHR;
		HSL_COLOR								   = GL_HSL_COLOR_KHR;
		HSL_LUMINOSITY							   = GL_HSL_LUMINOSITY_KHR;
		PRIMITIVE_BOUNDING_BOX					   = GL_PRIMITIVE_BOUNDING_BOX_EXT;
	}
}